

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::write_nonfinite<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,bool isinf,basic_format_specs<char> *specs,float_specs *fspecs)

{
  buffer_appender<char> bVar1;
  long in_RCX;
  byte in_SIL;
  size_t size;
  sign_t sign;
  size_t str_size;
  char *str;
  char *local_78;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa4;
  
  if ((in_SIL & 1) == 0) {
    if ((*(uint *)(in_RCX + 4) >> 0x10 & 1) == 0) {
      local_78 = "nan";
    }
    else {
      local_78 = "NAN";
    }
  }
  else if ((*(uint *)(in_RCX + 4) >> 0x10 & 1) == 0) {
    local_78 = "inf";
    in_stack_ffffffffffffff98 = local_78;
  }
  else {
    local_78 = "INF";
    in_stack_ffffffffffffff98 = local_78;
  }
  bVar1 = write_padded<(fmt::v7::align::type)1,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_nonfinite<char,fmt::v7::detail::buffer_appender<char>>(fmt::v7::detail::buffer_appender<char>,bool,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs_const&)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    ((buffer_appender<char>)local_78,
                     (basic_format_specs<char> *)
                     (CONCAT44(in_stack_ffffffffffffffa4,*(uint *)(in_RCX + 4) >> 8) &
                     0xffffffff000000ff),(size_t)in_stack_ffffffffffffff98,
                     (anon_class_16_2_632e021f *)local_78);
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_nonfinite(OutputIt out, bool isinf,
                         const basic_format_specs<Char>& specs,
                         const float_specs& fspecs) {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, [=](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    return copy_str<Char>(str, str + str_size, it);
  });
}